

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall
icu_63::Calendar::validateField(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (field == UCAL_DAY_OF_WEEK_IN_MONTH) {
    if (this->fFields[8] == 0) goto LAB_001e92fc;
    iVar3 = (*(this->super_UObject)._vptr_UObject[0xe])(this,8);
    iVar2 = (*(this->super_UObject)._vptr_UObject[0x10])(this,8);
    iVar4 = this->fFields[8];
    if (iVar4 < iVar3) goto LAB_001e92fc;
  }
  else {
    if (field == UCAL_DAY_OF_YEAR) {
      uVar1 = (*(this->super_UObject)._vptr_UObject[0x24])(this);
      iVar2 = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)uVar1);
      iVar4 = this->fFields[6];
    }
    else {
      if (field != UCAL_DATE) {
        iVar3 = (*(this->super_UObject)._vptr_UObject[0xe])(this,(ulong)field);
        iVar2 = (*(this->super_UObject)._vptr_UObject[0x10])(this,(ulong)field);
        iVar4 = this->fFields[field];
        if (iVar4 < iVar3) goto LAB_001e92fc;
        goto LAB_001e92f8;
      }
      uVar1 = (*(this->super_UObject)._vptr_UObject[0x24])(this);
      iVar2 = (*(this->super_UObject)._vptr_UObject[0x22])
                        (this,(ulong)uVar1,(ulong)(uint)this->fFields[2]);
      iVar4 = this->fFields[5];
    }
    if (iVar4 < 1) goto LAB_001e92fc;
  }
LAB_001e92f8:
  if (iVar4 <= iVar2) {
    return;
  }
LAB_001e92fc:
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return;
}

Assistant:

void Calendar::validateField(UCalendarDateFields field, UErrorCode &status) {
    int32_t y;
    switch (field) {
    case UCAL_DAY_OF_MONTH:
        y = handleGetExtendedYear();
        validateField(field, 1, handleGetMonthLength(y, internalGet(UCAL_MONTH)), status);
        break;
    case UCAL_DAY_OF_YEAR:
        y = handleGetExtendedYear();
        validateField(field, 1, handleGetYearLength(y), status);
        break;
    case UCAL_DAY_OF_WEEK_IN_MONTH:
        if (internalGet(field) == 0) {
#if defined (U_DEBUG_CAL)
            fprintf(stderr, "%s:%d: ILLEGAL ARG because DOW in month cannot be 0\n",
                __FILE__, __LINE__);
#endif
            status = U_ILLEGAL_ARGUMENT_ERROR; // "DAY_OF_WEEK_IN_MONTH cannot be zero"
            return;
        }
        validateField(field, getMinimum(field), getMaximum(field), status);
        break;
    default:
        validateField(field, getMinimum(field), getMaximum(field), status);
        break;
    }
}